

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

IGUICheckBox * __thiscall
irr::gui::CGUIEnvironment::addCheckBox
          (CGUIEnvironment *this,bool checked,rect<int> *rectangle,IGUIElement *parent,s32 id,
          wchar_t *text)

{
  int *piVar1;
  long lVar2;
  CGUICheckBox *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUICheckBox *)operator_new(0x158);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUICheckBox::CGUICheckBox(this_00,checked,&this->super_IGUIEnvironment,parent_00,id,*rectangle);
  if (text != (wchar_t *)0x0) {
    (**(code **)(*(long *)this_00 + 0xa0))(this_00,text);
  }
  lVar2 = *(long *)(*(long *)this_00 + -0x18);
  piVar1 = (int *)(&this_00->field_0x10 + lVar2);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
  }
  return (IGUICheckBox *)this_00;
}

Assistant:

IGUICheckBox *CGUIEnvironment::addCheckBox(bool checked, const core::rect<s32> &rectangle, IGUIElement *parent, s32 id, const wchar_t *text)
{
	IGUICheckBox *b = new CGUICheckBox(checked, this,
			parent ? parent : this, id, rectangle);

	if (text)
		b->setText(text);

	b->drop();
	return b;
}